

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highscore.h
# Opt level: O2

void __thiscall Highscore::Set(Highscore *this,size_t id,size_t score)

{
  __normal_iterator<Highscore::Entry_*,_std::vector<Highscore::Entry,_std::allocator<Highscore::Entry>_>_>
  _Var1;
  Entry *pEVar2;
  
  if (this->mLowestScore <= score) {
    _Var1 = std::
            __find_if<__gnu_cxx::__normal_iterator<Highscore::Entry*,std::vector<Highscore::Entry,std::allocator<Highscore::Entry>>>,__gnu_cxx::__ops::_Iter_pred<Highscore::Set(unsigned_long,unsigned_long)::_lambda(Highscore::Entry_const&)_1_>>
                      ((this->mEntries).
                       super__Vector_base<Highscore::Entry,_std::allocator<Highscore::Entry>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (this->mEntries).
                       super__Vector_base<Highscore::Entry,_std::allocator<Highscore::Entry>_>.
                       _M_impl.super__Vector_impl_data._M_finish,id);
    pEVar2 = (this->mEntries).
             super__Vector_base<Highscore::Entry,_std::allocator<Highscore::Entry>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (_Var1._M_current == pEVar2) {
      _Var1 = std::
              __find_if<__gnu_cxx::__normal_iterator<Highscore::Entry*,std::vector<Highscore::Entry,std::allocator<Highscore::Entry>>>,__gnu_cxx::__ops::_Iter_pred<Highscore::Set(unsigned_long,unsigned_long)::_lambda(Highscore::Entry_const&)_2_>>
                        ((this->mEntries).
                         super__Vector_base<Highscore::Entry,_std::allocator<Highscore::Entry>_>.
                         _M_impl.super__Vector_impl_data._M_start,pEVar2,score);
      pEVar2 = (this->mEntries).
               super__Vector_base<Highscore::Entry,_std::allocator<Highscore::Entry>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    if (_Var1._M_current != pEVar2) {
      (_Var1._M_current)->id = id;
      (_Var1._M_current)->score = score;
      _Var1 = std::
              __min_element<__gnu_cxx::__normal_iterator<Highscore::Entry*,std::vector<Highscore::Entry,std::allocator<Highscore::Entry>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        ((this->mEntries).
                         super__Vector_base<Highscore::Entry,_std::allocator<Highscore::Entry>_>.
                         _M_impl.super__Vector_impl_data._M_start);
      this->mLowestScore = (_Var1._M_current)->score;
    }
  }
  return;
}

Assistant:

void Set( const size_t id, const size_t score ) {
    if( score < mLowestScore )
      return;

    auto it = std::find_if(
      mEntries.begin(), mEntries.end(),
      [id]( const Entry& candidate ) { return id == candidate.id; } );

    if( it == mEntries.end() ) {
      it = std::find_if(
        mEntries.begin(), mEntries.end(),
        [score]( const Entry& candidate ) { return score > candidate.score; } );
    }

    if( it != mEntries.end() ) {
      it->id    = id;
      it->score = score;

      mLowestScore =
        std::min_element( mEntries.begin(), mEntries.end() )->score;
    }
  }